

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char **ppcVar2;
  char cVar3;
  lbool lVar4;
  int iVar5;
  vec<Minisat::Option_*,_int> *pvVar6;
  gzFile i;
  FILE *__s;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  size_t __size;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  vec<Minisat::Lit,_int> dummy;
  BoolOption strictp;
  IntOption mem_lim;
  IntOption cpu_lim;
  IntOption verb;
  Solver S;
  int local_540;
  int local_53c;
  vec<Minisat::Lit,_int> local_538;
  double local_520;
  double local_518;
  Lit local_50c;
  rusage local_508;
  gzFile local_478;
  char **local_470;
  Option local_468;
  char local_440;
  Option local_438;
  undefined8 local_410;
  int local_408;
  Option local_400;
  undefined8 local_3d8;
  uint32_t local_3d0;
  Option local_3c8;
  undefined8 local_3a0;
  int local_398;
  Solver local_390;
  
  local_540 = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  Minisat::setX86FPUPrecision();
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_3c8.name = "verb";
  local_3c8.description = "Verbosity level (0=silent, 1=some, 2=more).";
  local_3c8.category = "MAIN";
  local_3c8.type_name = "<int32>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_3c8;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00113c70;
  local_3a0 = 0x200000000;
  local_398 = 1;
  local_400._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_400.name = "cpu-lim";
  local_400.description = "Limit on CPU time allowed in seconds.\n";
  local_400.category = "MAIN";
  local_400.type_name = "<int32>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_400;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_400._vptr_Option = (_func_int **)&PTR__Option_00113c70;
  local_3d8 = 0x7fffffff00000000;
  local_3d0 = 0;
  local_438._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_438.name = "mem-lim";
  local_438.description = "Limit on memory usage in megabytes.\n";
  local_438.category = "MAIN";
  local_438.type_name = "<int32>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_438;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_438._vptr_Option = (_func_int **)&PTR__Option_00113c70;
  local_410 = 0x7fffffff00000000;
  local_408 = 0;
  local_468._vptr_Option = (_func_int **)&PTR__Option_00113cc8;
  local_468.name = "strict";
  local_468.description = "Validate DIMACS header during parsing.";
  local_468.category = "MAIN";
  local_468.type_name = "<bool>";
  pvVar6 = Minisat::Option::getOptionList();
  local_390._vptr_Solver = (_func_int **)&local_468;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar6,(Option **)&local_390);
  local_468._vptr_Option = (_func_int **)&PTR__Option_00113cf8;
  local_440 = '\0';
  Minisat::parseOptions(&local_540,argv,true);
  Minisat::Solver::Solver(&local_390);
  getrusage(RUSAGE_SELF,&local_508);
  local_518 = (double)local_508.ru_utime.tv_sec;
  local_520 = (double)local_508.ru_utime.tv_usec;
  local_390.verbosity = local_398;
  solver = &local_390;
  Minisat::sigTerm(SIGINT_exit);
  if (local_3d0 != 0) {
    Minisat::limitTime(local_3d0);
  }
  if ((long)local_408 != 0) {
    Minisat::limitMemory((long)local_408);
  }
  if (local_540 == 1) {
    puts("Reading from standard input... Use \'--help\' for help.");
  }
  if (local_540 == 1) {
    i = (gzFile)gzdopen(0,"rb");
  }
  else {
    i = (gzFile)gzopen(argv[1],"rb");
  }
  if (i == (gzFile)0x0) {
    if (local_540 == 1) {
      pcVar8 = "<stdin>";
    }
    else {
      pcVar8 = argv[1];
    }
    printf("ERROR! Could not open file: %s\n",pcVar8);
    exit(1);
  }
  if (0 < local_390.verbosity) {
    puts("============================[ Problem Statistics ]=============================");
    puts("|                                                                             |");
  }
  cVar3 = local_440;
  Minisat::StreamBuffer::StreamBuffer((StreamBuffer *)&local_508,i);
  local_520 = local_520 / 1000000.0 + local_518;
  local_538.data = (Lit *)0x0;
  local_538.sz = 0;
  local_538.cap = 0;
  iVar10 = 0;
  local_53c = 0;
  local_478 = i;
  local_470 = argv;
LAB_0010623e:
  do {
    Minisat::skipWhitespace<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
    if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
      if ((cVar3 != '\0') && (iVar10 != local_53c)) {
        puts("PARSE ERROR! DIMACS header mismatch: wrong number of clauses");
      }
      ppcVar2 = local_470;
      if (local_538.data != (Lit *)0x0) {
        local_538._8_8_ = local_538._8_8_ & 0xffffffff00000000;
        free(local_538.data);
        local_538.data = (Lit *)0x0;
        local_538._8_8_ = local_538._8_8_ & 0xffffffff;
      }
      free((void *)local_508.ru_utime.tv_usec);
      gzclose();
      if (local_540 < 3) {
        __s = (FILE *)0x0;
      }
      else {
        __s = fopen(ppcVar2[2],"wb");
      }
      if (0 < local_390.verbosity) {
        printf("|  Number of variables:  %12d                                         |\n",
               (ulong)(uint)local_390.next_var);
        printf("|  Number of clauses:    %12d                                         |\n",
               (ulong)(uint)local_390.num_clauses);
      }
      getrusage(RUSAGE_SELF,&local_508);
      if (0 < local_390.verbosity) {
        printf("|  Parse time:           %12.2f s                                       |\n",
               SUB84(((double)local_508.ru_utime.tv_sec +
                     (double)local_508.ru_utime.tv_usec / 1000000.0) - local_520,0));
        puts("|                                                                             |");
      }
      Minisat::sigTerm(SIGINT_interrupt);
      bVar13 = Minisat::Solver::simplify(&local_390);
      if (!bVar13) {
        if (__s != (FILE *)0x0) {
          fwrite("UNSAT\n",6,1,__s);
          fclose(__s);
        }
        if (0 < local_390.verbosity) {
          puts("===============================================================================");
          puts("Solved by unit propagation");
          Minisat::Solver::printStats(&local_390);
          putchar(10);
        }
        puts("UNSATISFIABLE");
        exit(0x14);
      }
      local_508.ru_utime.tv_sec = 0;
      local_508.ru_utime.tv_usec = 0;
      Minisat::vec<Minisat::Lit,_int>::copyTo
                ((vec<Minisat::Lit,_int> *)&local_508,&local_390.assumptions);
      lVar4 = Minisat::Solver::solve_(&local_390);
      if (0 < local_390.verbosity) {
        Minisat::Solver::printStats(&local_390);
        putchar(10);
      }
      pcVar8 = "INDETERMINATE\n";
      if (lVar4.value == '\x01') {
        pcVar8 = "UNSATISFIABLE\n";
      }
      pcVar9 = "SATISFIABLE\n";
      if (lVar4.value != '\0') {
        pcVar9 = pcVar8;
      }
      printf(pcVar9);
      if (__s != (FILE *)0x0) {
        if (lVar4.value == '\0') {
          fwrite("SAT\n",4,1,__s);
          if (0 < local_390.next_var) {
            lVar7 = 0;
            do {
              if ((local_390.model.data[lVar7].value & 2) == 0) {
                pcVar8 = " ";
                if (lVar7 == 0) {
                  pcVar8 = "";
                }
                pcVar9 = "";
                if (local_390.model.data[lVar7].value != 0) {
                  pcVar9 = "-";
                }
                fprintf(__s,"%s%s%d",pcVar8,pcVar9,(ulong)((int)lVar7 + 1));
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_390.next_var);
          }
          pcVar8 = " 0\n";
          __size = 3;
        }
        else {
          if (lVar4.value == '\x01') {
            pcVar8 = "UNSAT\n";
          }
          else {
            pcVar8 = "INDET\n";
          }
          __size = 6;
        }
        fwrite(pcVar8,__size,1,__s);
        fclose(__s);
      }
      if ((void *)local_508.ru_utime.tv_sec != (void *)0x0) {
        local_508.ru_utime.tv_usec = local_508.ru_utime.tv_usec & 0xffffffff00000000;
        free((void *)local_508.ru_utime.tv_sec);
        local_508.ru_utime.tv_sec = 0;
        local_508.ru_utime.tv_usec = local_508.ru_utime.tv_usec & 0xffffffff;
      }
      iVar10 = 0x14;
      if (lVar4.value != '\x01') {
        iVar10 = 0;
      }
      iVar5 = 10;
      if (lVar4.value != '\0') {
        iVar5 = iVar10;
      }
      Minisat::Solver::~Solver(&local_390);
      return iVar5;
    }
    if (*(char *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec) == 'p') {
      lVar7 = 1;
      bVar13 = false;
      cVar1 = 'p';
      do {
        uVar12 = 0xffffffff;
        if ((int)local_508.ru_stime.tv_sec < local_508.ru_stime.tv_sec._4_4_) {
          uVar12 = (uint)*(byte *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec);
        }
        if (uVar12 != (int)cVar1) break;
        local_508.ru_stime.tv_sec._0_4_ = (int)local_508.ru_stime.tv_sec + 1;
        if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
          local_508.ru_stime.tv_sec._0_4_ = 0;
          local_508.ru_stime.tv_sec._4_4_ =
               gzread(local_508.ru_utime.tv_sec,local_508.ru_utime.tv_usec,0x10000);
        }
        cVar1 = "p cnf"[lVar7];
        bVar13 = cVar1 == '\0';
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      if (!bVar13) {
        uVar11 = 0xffffffff;
        if ((int)local_508.ru_stime.tv_sec < local_508.ru_stime.tv_sec._4_4_) {
          uVar11 = (ulong)*(byte *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec);
        }
        printf("PARSE ERROR! Unexpected char: %c\n",uVar11);
        exit(3);
      }
      Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      local_53c = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      goto LAB_0010623e;
    }
    if (*(char *)(local_508.ru_utime.tv_usec + (int)local_508.ru_stime.tv_sec) == 'c') {
      do {
        lVar7 = (long)(int)local_508.ru_stime.tv_sec;
        local_508.ru_stime.tv_sec._0_4_ = (int)local_508.ru_stime.tv_sec + 1;
        if (*(char *)(local_508.ru_utime.tv_usec + lVar7) == '\n') {
          if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
            local_508.ru_stime.tv_sec._0_4_ = 0;
            local_508.ru_stime.tv_sec._4_4_ =
                 gzread(local_508.ru_utime.tv_sec,local_508.ru_utime.tv_usec,0x10000);
          }
          break;
        }
        if (local_508.ru_stime.tv_sec._4_4_ <= (int)local_508.ru_stime.tv_sec) {
          local_508.ru_stime.tv_sec._0_4_ = 0;
          local_508.ru_stime.tv_sec._4_4_ =
               gzread(local_508.ru_utime.tv_sec,local_508.ru_utime.tv_usec,0x10000);
        }
      } while ((int)local_508.ru_stime.tv_sec < local_508.ru_stime.tv_sec._4_4_);
    }
    else {
      if (local_538.data != (Lit *)0x0) {
        local_538._8_8_ = local_538._8_8_ & 0xffffffff00000000;
      }
      iVar5 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      local_518 = (double)CONCAT44(local_518._4_4_,iVar10);
      while (iVar5 != 0) {
        iVar10 = -iVar5;
        if (0 < iVar5) {
          iVar10 = iVar5;
        }
        while (local_390.next_var < iVar10) {
          Minisat::Solver::newVar(&local_390,(lbool)0x2,true);
        }
        local_50c.x = ((iVar5 < 1) - 2) + iVar10 * 2;
        Minisat::vec<Minisat::Lit,_int>::push(&local_538,&local_50c);
        iVar5 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_508);
      }
      iVar10 = local_518._0_4_ + 1;
      Minisat::Solver::addClause_(&local_390,&local_538);
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n");
        setX86FPUPrecision();

        // Extra options:
        //
        IntOption    verb   ("MAIN", "verb",   "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 2));
        IntOption    cpu_lim("MAIN", "cpu-lim","Limit on CPU time allowed in seconds.\n", 0, IntRange(0, INT32_MAX));
        IntOption    mem_lim("MAIN", "mem-lim","Limit on memory usage in megabytes.\n", 0, IntRange(0, INT32_MAX));
        BoolOption   strictp("MAIN", "strict", "Validate DIMACS header during parsing.", false);
        
        parseOptions(argc, argv, true);

        Solver S;
        double initial_time = cpuTime();

        S.verbosity = verb;
        
        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        sigTerm(SIGINT_exit);

        // Try to set resource limits:
        if (cpu_lim != 0) limitTime(cpu_lim);
        if (mem_lim != 0) limitMemory(mem_lim);
        
        if (argc == 1)
            printf("Reading from standard input... Use '--help' for help.\n");
        
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
        if (in == NULL)
            printf("ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);
        
        if (S.verbosity > 0){
            printf("============================[ Problem Statistics ]=============================\n");
            printf("|                                                                             |\n"); }
        
        parse_DIMACS(in, S, (bool)strictp);
        gzclose(in);
        FILE* res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;
        
        if (S.verbosity > 0){
            printf("|  Number of variables:  %12d                                         |\n", S.nVars());
            printf("|  Number of clauses:    %12d                                         |\n", S.nClauses()); }
        
        double parsed_time = cpuTime();
        if (S.verbosity > 0){
            printf("|  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);
            printf("|                                                                             |\n"); }
 
        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        sigTerm(SIGINT_interrupt);
       
        if (!S.simplify()){
            if (res != NULL) fprintf(res, "UNSAT\n"), fclose(res);
            if (S.verbosity > 0){
                printf("===============================================================================\n");
                printf("Solved by unit propagation\n");
                S.printStats();
                printf("\n"); }
            printf("UNSATISFIABLE\n");
            exit(20);
        }
        
        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);
        if (S.verbosity > 0){
            S.printStats();
            printf("\n"); }
        printf(ret == l_True ? "SATISFIABLE\n" : ret == l_False ? "UNSATISFIABLE\n" : "INDETERMINATE\n");
        if (res != NULL){
            if (ret == l_True){
                fprintf(res, "SAT\n");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i==0)?"":" ", (S.model[i]==l_True)?"":"-", i+1);
                fprintf(res, " 0\n");
            }else if (ret == l_False)
                fprintf(res, "UNSAT\n");
            else
                fprintf(res, "INDET\n");
            fclose(res);
        }
        
#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0);     // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException&){
        printf("===============================================================================\n");
        printf("INDETERMINATE\n");
        exit(0);
    }
}